

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void Imf_3_4::anon_unknown_1::clearCompressionRecord(Header *hdr)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  pthread_mutex_t *__mutex;
  _Base_ptr p_Var4;
  iterator __position;
  
  __mutex = (pthread_mutex_t *)getStash();
  if (__mutex == (pthread_mutex_t *)0x0) {
    return;
  }
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    p_Var1 = (_Base_ptr)((long)__mutex + 0x30);
    p_Var4 = p_Var1;
    for (p_Var2 = *(_Base_ptr *)((long)__mutex + 0x38); p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(Header **)(p_Var2 + 1) < hdr]) {
      if (*(Header **)(p_Var2 + 1) >= hdr) {
        p_Var4 = p_Var2;
      }
    }
    __position._M_node = p_Var1;
    if ((p_Var4 != p_Var1) && (__position._M_node = p_Var4, hdr < *(Header **)(p_Var4 + 1))) {
      __position._M_node = p_Var1;
    }
    if (__position._M_node != p_Var1) {
      std::
      map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
      ::erase_abi_cxx11_((map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
                          *)&__mutex[1].__data,__position);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

static void
clearCompressionRecord (Header* hdr)
{
    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (hdr);
        if (i != s->_store.end ()) s->_store.erase (i);
    }
}